

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

bool __thiscall
google::protobuf::DescriptorPool::Tables::AddSymbol(Tables *this,string *full_name,Symbol symbol)

{
  bool bVar1;
  value_type local_40;
  first_type local_38;
  string *local_30;
  string *full_name_local;
  Tables *this_local;
  Symbol symbol_local;
  
  symbol_local._0_8_ = symbol.field_1;
  this_local._0_4_ = symbol.type;
  local_30 = full_name;
  full_name_local = (string *)this;
  local_38 = (first_type)std::__cxx11::string::c_str();
  bVar1 = InsertIfNotPresent<google::protobuf::hash_map<char_const*,google::protobuf::Symbol,google::protobuf::hash<char_const*>,google::protobuf::streq,std::allocator<std::pair<char_const*const,google::protobuf::Symbol>>>>
                    (&this->symbols_by_name_,&local_38,(second_type *)&this_local);
  if (bVar1) {
    local_40 = (value_type)std::__cxx11::string::c_str();
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
              (&this->symbols_after_checkpoint_,&local_40);
  }
  return bVar1;
}

Assistant:

bool DescriptorPool::Tables::AddSymbol(
    const string& full_name, Symbol symbol) {
  if (InsertIfNotPresent(&symbols_by_name_, full_name.c_str(), symbol)) {
    symbols_after_checkpoint_.push_back(full_name.c_str());
    return true;
  } else {
    return false;
  }
}